

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::classifyChannels
          (DwaCompressor *this,ChannelList *channels,
          vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *chanData,
          vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
          *cscData)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  pointer pCVar4;
  undefined8 uVar5;
  pointer pCVar6;
  bool bVar7;
  iterator iVar8;
  Iterator IVar9;
  long lVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  size_type __new_size;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  pointer this_00;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  tmpCscSet;
  string prefix;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  prefixMap;
  string suffix;
  string local_50 [32];
  
  prefixMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prefixMap._M_t._M_impl.super__Rb_tree_header._M_header;
  prefixMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prefixMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prefixMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tmpCscSet.
  super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmpCscSet.
  super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpCscSet.
  super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prefixMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prefixMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar8._M_node = (_Base_ptr)ChannelList::begin(channels);
  uVar14 = 0;
  while( true ) {
    IVar9 = ChannelList::end(channels);
    if ((iterator)iVar8._M_node == IVar9._i._M_node) break;
    uVar14 = uVar14 + 1;
    iVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar8._M_node);
  }
  if (uVar14 != 0) {
    std::
    vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
    ::resize(chanData,(ulong)uVar14);
  }
  iVar8._M_node = (_Base_ptr)ChannelList::begin(channels);
  uVar15 = 0;
  while( true ) {
    IVar9 = ChannelList::end(channels);
    if ((iterator)iVar8._M_node == IVar9._i._M_node) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,(char *)(iVar8._M_node + 1),(allocator<char> *)&suffix);
    std::__cxx11::string::operator=
              ((string *)
               ((chanData->
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar15),(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    pCVar4 = (chanData->
             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar4[uVar15].compression = UNKNOWN;
    uVar5 = *(undefined8 *)&iVar8._M_node[9].field_0x4;
    pCVar4[uVar15].xSampling = (int)uVar5;
    pCVar4[uVar15].ySampling = (int)((ulong)uVar5 >> 0x20);
    pCVar4[uVar15].type = iVar8._M_node[9]._M_color;
    pCVar4[uVar15].pLinear = *(bool *)((long)&iVar8._M_node[9]._M_parent + 4);
    uVar15 = uVar15 + 1;
    iVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar8._M_node);
  }
  for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"",(allocator<char> *)&suffix);
    std::__cxx11::string::string
              ((string *)&suffix,
               (string *)
               ((chanData->
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar16));
    lVar10 = std::__cxx11::string::rfind((char)&suffix,0x2e);
    if (lVar10 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&suffix);
      std::__cxx11::string::operator=((string *)&prefix,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::substr((ulong)local_50,(ulong)&suffix);
      std::__cxx11::string::operator=((string *)&suffix,local_50);
      std::__cxx11::string::~string(local_50);
    }
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
             ::find(&prefixMap._M_t,&prefix);
    if ((_Rb_tree_header *)iVar11._M_node == &prefixMap._M_t._M_impl.super__Rb_tree_header) {
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                ::operator[](&prefixMap,&prefix);
      pmVar12->idx[0] = -1;
      pmVar12->idx[1] = -1;
      pmVar12->idx[2] = -1;
    }
    for (this_00 = (this->_channelRules).
                   super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (this->_channelRules).
        super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar7 = Classifier::match(this_00,&suffix,
                                (chanData->
                                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16].type);
      if ((bVar7) &&
         ((chanData->
          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar16].compression = this_00->_scheme,
         -1 < this_00->_cscIdx)) {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                  ::operator[](&prefixMap,&prefix);
        pmVar12->idx[this_00->_cscIdx] = (int)uVar16;
      }
    }
    std::__cxx11::string::~string((string *)&suffix);
    std::__cxx11::string::~string((string *)&prefix);
  }
  for (p_Var13 = prefixMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &prefixMap._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
    _Var1 = p_Var13[2]._M_color;
    _Var2 = *(_Rb_tree_color *)&p_Var13[2].field_0x4;
    _Var3 = *(_Rb_tree_color *)&p_Var13[2]._M_parent;
    if (-1 < (int)(_Var1 | _Var2 | _Var3)) {
      pCVar4 = (chanData->
               super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((pCVar4[_Var1].xSampling == pCVar4[_Var2].xSampling) &&
           (pCVar4[_Var1].xSampling == pCVar4[_Var3].xSampling)) &&
          (pCVar4[_Var1].ySampling == pCVar4[_Var2].ySampling)) &&
         (pCVar4[_Var1].ySampling == pCVar4[_Var3].ySampling)) {
        std::
        vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
        ::push_back(&tmpCscSet,(value_type *)(p_Var13 + 2));
      }
    }
  }
  __new_size = ((long)tmpCscSet.
                      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)tmpCscSet.
                     super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  if (tmpCscSet.
      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      tmpCscSet.
      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::resize(cscData,__new_size);
  }
  for (uVar14 = 0; uVar16 = (ulong)uVar14, uVar16 < __new_size; uVar14 = uVar14 + 1) {
    pCVar6 = (cscData->
             super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar6[uVar16].idx[2] =
         tmpCscSet.
         super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar16].idx[2];
    *(undefined8 *)pCVar6[uVar16].idx =
         *(undefined8 *)
          tmpCscSet.
          super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].idx;
  }
  std::
  _Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ::~_Vector_base(&tmpCscSet.
                   super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                 );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  ::~_Rb_tree(&prefixMap._M_t);
  return;
}

Assistant:

void
DwaCompressor::classifyChannels
    (ChannelList channels,
     std::vector<ChannelData> &chanData,
     std::vector<CscChannelSet> &cscData)
{
    //
    // prefixMap used to map channel name prefixes to 
    // potential CSC-able sets of channels.
    //

    std::map<std::string, DwaCompressor::CscChannelSet> prefixMap;
    std::vector<DwaCompressor::CscChannelSet>           tmpCscSet;

    unsigned int numChan = 0;

    for (ChannelList::Iterator c = channels.begin(); c != channels.end(); ++c)
        numChan++;
    
    if (numChan)
        chanData.resize (numChan);

    //
    // Cache the relevant data from the channel structs.
    //

    unsigned int offset = 0;

    for (ChannelList::Iterator c = channels.begin(); c != channels.end(); ++c)
    {
        chanData[offset].name        = std::string (c.name());
        chanData[offset].compression = UNKNOWN;
        chanData[offset].xSampling   = c.channel().xSampling;
        chanData[offset].ySampling   = c.channel().ySampling;
        chanData[offset].type        = c.channel().type;
        chanData[offset].pLinear     = c.channel().pLinear;

        offset++;
    }

    //
    // Try and figure out which channels should be
    // compressed by which means.
    //

    for (offset = 0; offset<numChan; ++offset)
    {
        std::string prefix  = "";
        std::string suffix  = chanData[offset].name;
        size_t      lastDot = suffix.find_last_of ('.');

        if (lastDot != std::string::npos)
        {
            prefix = suffix.substr (0,         lastDot);
            suffix = suffix.substr (lastDot+1, std::string::npos);
        } 

        //
        // Make sure we have an entry in our CSC set map 
        //

        std::map<std::string, DwaCompressor::CscChannelSet>::iterator 
            theSet = prefixMap.find (prefix);

        if (theSet == prefixMap.end())
        {
            DwaCompressor::CscChannelSet tmpSet;

            tmpSet.idx[0] = 
            tmpSet.idx[1] = 
            tmpSet.idx[2] = -1;

            prefixMap[prefix] = tmpSet;
        }

        // 
        // Check the suffix against the list of classifications
        // we defined previously. If the _cscIdx is not negative,
        // it indicates that we should be part of a CSC group.
        //

        for (std::vector<Classifier>::iterator i = _channelRules.begin();
             i != _channelRules.end();
             ++i)
        {
            if ( i->match(suffix, chanData[offset].type) )
            {
                chanData[offset].compression = i->_scheme;

                if ( i->_cscIdx >= 0)
                    prefixMap[prefix].idx[i->_cscIdx] = offset;
            }
        }
    }

    //
    // Finally, try and find RGB sets of channels which 
    // can be CSC'ed to a Y'CbCr space prior to loss, for
    // better compression.
    //
    // Walk over our set of candidates, and see who has
    // all three channels defined (and has common sampling
    // patterns, etc).
    //

    for (std::map<std::string, DwaCompressor::CscChannelSet>::iterator 
         theItem = prefixMap.begin(); theItem != prefixMap.end();
         ++theItem)
    {
        int red = (*theItem).second.idx[0];
        int grn = (*theItem).second.idx[1];
        int blu = (*theItem).second.idx[2];

        if ((red < 0) || (grn < 0) || (blu < 0))
            continue;

        if ((chanData[red].xSampling != chanData[grn].xSampling) ||
            (chanData[red].xSampling != chanData[blu].xSampling) ||
            (chanData[grn].xSampling != chanData[blu].xSampling) ||
            (chanData[red].ySampling != chanData[grn].ySampling) ||
            (chanData[red].ySampling != chanData[blu].ySampling) ||
            (chanData[grn].ySampling != chanData[blu].ySampling))
        {
            continue;
        }
        
        tmpCscSet.push_back ((*theItem).second);
    }
    
    size_t numCsc = tmpCscSet.size();

    if (numCsc)
        cscData.resize(numCsc);

    for (offset = 0; offset < numCsc; ++offset)
        cscData[offset] = tmpCscSet[offset];
}